

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void QIconModeViewBase::addLeaf(QList<int> *leaf,QRect *area,uint visited,Data data)

{
  bool bVar1;
  char cVar2;
  pointer pQVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  QListViewItem *this;
  long in_FS_OFFSET;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (uVar4 = 0; uVar4 < (ulong)(leaf->d).size; uVar4 = uVar4 + 1) {
    uVar5 = (ulong)(leaf->d).ptr[uVar4];
    if ((-1 < (long)uVar5) && (uVar5 < *(ulong *)((long)data.field_0 + 0x70))) {
      pQVar3 = QList<QListViewItem>::data((QList<QListViewItem> *)((long)data.field_0 + 0x60));
      this = pQVar3 + uVar5;
      bVar1 = QListViewItem::isValid(this);
      if (bVar1) {
        local_58._0_16_ = QListViewItem::rect(this);
        cVar2 = QRect::intersects((QRect *)&local_58);
        if ((cVar2 != '\0') && (this->visited != visited)) {
          local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QListViewPrivate::listViewItemToIndex
                    (&local_58,*(QListViewPrivate **)((long)data.field_0 + 8),this);
          QList<QModelIndex>::emplaceBack<QModelIndex_const&>
                    (*(QList<QModelIndex> **)((long)data.field_0 + 0xb0),&local_58);
          this->visited = visited;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::addLeaf(QList<int> &leaf, const QRect &area, uint visited,
                                QBspTree::Data data)
{
    QListViewItem *vi;
    QIconModeViewBase *_this = static_cast<QIconModeViewBase *>(data.ptr);
    for (int i = 0; i < leaf.size(); ++i) {
        int idx = leaf.at(i);
        if (idx < 0 || idx >= _this->items.size())
            continue;
        vi = &_this->items[idx];
        Q_ASSERT(vi);
        if (vi->isValid() && vi->rect().intersects(area) && vi->visited != visited) {
            QModelIndex index  = _this->dd->listViewItemToIndex(*vi);
            Q_ASSERT(index.isValid());
            _this->interSectingVector->append(index);
            vi->visited = visited;
        }
    }
}